

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double reciprocal_cdf_inv(double cdf,double a,double b)

{
  double dVar1;
  double local_28;
  double x;
  double b_local;
  double a_local;
  double cdf_local;
  
  local_28 = 0.0;
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    if ((cdf != 0.0) || (NAN(cdf))) {
      if (0.0 < cdf) {
        local_28 = pow(b,cdf);
        dVar1 = pow(a,cdf - 1.0);
        local_28 = local_28 / dVar1;
      }
    }
    else {
      local_28 = 0.0;
    }
    return local_28;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"RECIPROCAL_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double reciprocal_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    RECIPROCAL_CDF_INV inverts the Reciprocal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A <= B.
//
//    Output, double RECIPROCAL_CDF_INV, the corresponding argument of the CDF.
//
{
  double x = 0.0;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "RECIPROCAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = 0.0;
  }
  else if ( 0.0 < cdf )
  {
    x = pow ( b, cdf ) / pow ( a, ( cdf - 1.0 ) );
  }

  return x;
}